

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupSimpleDfsPart(Aig_Man_t *p,Vec_Ptr_t *vPis,Vec_Ptr_t *vPos)

{
  Aig_Man_t *p_00;
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar3 = 0; iVar3 < vPis->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(vPis,iVar3);
    pAVar2 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
  }
  for (iVar3 = 0; iVar3 < vPos->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(vPos,iVar3);
    pAVar2 = Aig_ManDupSimpleDfs_rec
                       (p_00,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe));
    Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                         ((ulong)((uint)*(undefined8 *)((long)pvVar1 + 8) & 1) ^ (ulong)pAVar2));
  }
  Aig_ManSetRegNum(p_00,0);
  iVar3 = Aig_ManCheck(p_00);
  if (iVar3 == 0) {
    puts("Aig_ManDupSimple(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupSimpleDfsPart( Aig_Man_t * p, Vec_Ptr_t * vPis, Vec_Ptr_t * vPos )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1( pNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, vPis, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // duplicate internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vPos, pObj, i )
    {
        pObjNew = Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );        
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
        Aig_ObjCreateCo( pNew, pObjNew );
    }
    Aig_ManSetRegNum( pNew, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}